

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_set_word(BIGNUM *a,ulong w)

{
  BIGNUM *pBVar1;
  uint local_4;
  
  pBVar1 = bn_expand((BIGNUM *)w,0);
  if (pBVar1 != (BIGNUM *)0x0) {
    a->neg = 0;
    *a->d = w;
    a->top = (uint)(w != 0);
    a->flags = a->flags;
  }
  local_4 = (uint)(pBVar1 != (BIGNUM *)0x0);
  return local_4;
}

Assistant:

int BN_set_word(BIGNUM *a, BN_ULONG w)
{
    bn_check_top(a);
    if (bn_expand(a, (int)sizeof(BN_ULONG) * 8) == NULL)
        return 0;
    a->neg = 0;
    a->d[0] = w;
    a->top = (w ? 1 : 0);
    a->flags &= ~BN_FLG_FIXED_TOP;
    bn_check_top(a);
    return 1;
}